

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

BinSelectWithFilterExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::BinSelectWithFilterExpr,slang::ast::BinsSelectExpr_const&,slang::ast::Expression_const&,slang::ast::Expression_const*&>
          (BumpAllocator *this,BinsSelectExpr *args,Expression *args_1,Expression **args_2)

{
  Expression *pEVar1;
  BinSelectWithFilterExpr *pBVar2;
  
  pBVar2 = (BinSelectWithFilterExpr *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((BinSelectWithFilterExpr *)this->endPtr < pBVar2 + 1) {
    pBVar2 = (BinSelectWithFilterExpr *)allocateSlow(this,0x28,8);
  }
  else {
    this->head->current = (byte *)(pBVar2 + 1);
  }
  pEVar1 = *args_2;
  (pBVar2->super_BinsSelectExpr).kind = WithFilter;
  (pBVar2->super_BinsSelectExpr).syntax = (SyntaxNode *)0x0;
  pBVar2->expr = args;
  pBVar2->filter = args_1;
  pBVar2->matchesExpr = pEVar1;
  return pBVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }